

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall tinyusdz::Attribute::get_value<unsigned_int>(Attribute *this,uint *v)

{
  value_type_conflict3 *pvVar1;
  optional<unsigned_int> ret;
  optional<unsigned_int> local_28;
  optional<unsigned_int> local_20;
  
  if (v == (uint *)0x0) {
    local_28.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<unsigned_int>(&local_28,&this->_var);
    local_20.has_value_ = local_28.has_value_;
    if (local_28.has_value_ != false) {
      local_20.contained = local_28.contained;
      pvVar1 = nonstd::optional_lite::optional<unsigned_int>::value(&local_20);
      *v = *pvVar1;
    }
  }
  return local_28.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }